

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O2

MPP_RET mpp_task_meta_get_packet(MppTask task,MppMetaKey key,MppPacket *packet)

{
  MPP_RET MVar1;
  
  MVar1 = check_mpp_task_name(task);
  if (MVar1 == MPP_OK) {
    MVar1 = mpp_meta_get_packet(*(MppMeta *)((long)task + 0x28),key,packet);
    if (MVar1 == MPP_OK) {
      MVar1 = MPP_OK;
    }
    else {
      *packet = (MppPacket)0x0;
    }
  }
  else {
    MVar1 = MPP_NOK;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_task_meta_get_packet(MppTask task, MppMetaKey key, MppPacket *packet)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_packet(impl->meta, key, packet);
    if (ret)
        *packet = NULL;
    return ret;
}